

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

ValueType * HighsHashTree<int,_void>::find_recurse(NodePtr node,uint64_t hash,int hashPos,int *key)

{
  ulong uVar1;
  ValueType *pVVar2;
  long *plVar3;
  uint uVar4;
  
  do {
code_r0x00277f42:
    switch((uint)node.ptrAndType & 7) {
    case 0:
      return (ValueType *)0x0;
    case 1:
      plVar3 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
      do {
        if ((int)plVar3[1] == *key) {
          return (ValueType *)(plVar3 + 1);
        }
        plVar3 = (long *)*plVar3;
      } while (plVar3 != (long *)0x0);
      return (ValueType *)0x0;
    case 2:
      pVVar2 = InnerLeaf<1>::find_entry
                         ((InnerLeaf<1> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 3:
      pVVar2 = InnerLeaf<2>::find_entry
                         ((InnerLeaf<2> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 4:
      pVVar2 = InnerLeaf<3>::find_entry
                         ((InnerLeaf<3> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 5:
      pVVar2 = InnerLeaf<4>::find_entry
                         ((InnerLeaf<4> *)(node.ptrAndType & 0xfffffffffffffff8),hash,hashPos,key);
      return pVVar2;
    case 6:
      uVar4 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
      uVar1 = *(ulong *)(node.ptrAndType & 0xfffffffffffffff8);
      if ((uVar1 >> uVar4 & 1) == 0) {
        return (ValueType *)0x0;
      }
      node.ptrAndType =
           ((ulong *)(node.ptrAndType & 0xfffffffffffffff8))[POPCOUNT(uVar1 >> (sbyte)uVar4)];
      hashPos = hashPos + 1;
      break;
    default:
      goto code_r0x00277f42;
    }
  } while( true );
}

Assistant:

static const ValueType* find_recurse(NodePtr node, uint64_t hash, int hashPos,
                                       const K& key) {
    int startPos = hashPos;
    switch (node.getType()) {
      case kEmpty:
        return nullptr;
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();
        ListNode* iter = &leaf->first;
        do {
          if (iter->entry.key() == key) return &iter->entry.value();
          iter = iter->next;
        } while (iter != nullptr);
        return nullptr;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return leaf->find_entry(hash, hashPos, key);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        if (!branch->occupation.test(get_hash_chunk(hash, hashPos)))
          return nullptr;
        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        node = branch->child[location];
        ++hashPos;
      }
    }

    assert(hashPos > startPos);

    return find_recurse(node, hash, hashPos, key);
  }